

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5UpdateMethod(sqlite3_vtab *pVtab,int nArg,sqlite3_value **apVal,sqlite_int64 *pRowid)

{
  i64 *piVar1;
  long *plVar2;
  byte bVar3;
  sqlite3_module *psVar4;
  sqlite3_value *pVal;
  Fts5Config *pFVar5;
  ushort *puVar6;
  long lVar7;
  Fts5Storage *pFVar8;
  Fts5StructureSegment *pFVar9;
  ushort uVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  _func_int_sqlite3_vtab_cursor_ptr *p_Var16;
  char *pcVar17;
  long lVar18;
  i64 iDel;
  i64 iVar19;
  Fts5Structure *pFVar20;
  Fts5Structure *pFVar21;
  void *pvVar22;
  Mem *pMVar23;
  Fts5Index *pFVar24;
  uchar *puVar25;
  u8 *puVar26;
  Fts5Data *pFVar27;
  Fts5DlidxIter *pIter;
  ulong uVar28;
  ulong uVar29;
  int iVar30;
  Fts5StructureLevel *pFVar31;
  long lVar32;
  Fts5Storage *pFVar33;
  u32 uVar34;
  void *p;
  sqlite3_stmt *psVar35;
  uint uVar36;
  ulong uVar37;
  bool bVar38;
  bool bVar39;
  int local_16c;
  Fts5Storage *local_168;
  Fts5Index *local_160;
  i64 nRow;
  undefined8 uStack_150;
  Fts5Iter *local_140;
  Fts5StructureSegment *local_138;
  void *local_130;
  int local_124;
  int local_120;
  int nKeep;
  Fts5Buffer buf;
  Fts5Termset *pFStack_100;
  i64 iPos;
  ulong uStack_e0;
  Fts5Structure *local_d0;
  sqlite3_stmt *pStmt;
  int local_bc;
  Fts5Buffer local_b8;
  uchar *local_a0;
  sqlite3_stmt *local_98;
  Fts5Data *local_90;
  ulong local_88;
  long local_80;
  long local_78;
  int local_70;
  int nTerm;
  u32 local_68;
  int nIncr;
  Fts5StructureLevel *local_60;
  ulong local_58;
  Fts5StructureLevel *local_50;
  long local_48;
  i64 local_40;
  sqlite3_stmt *pScan;
  
  psVar4 = pVtab[1].pModule;
  local_16c = 0;
  psVar4->xSavepoint = (_func_int_sqlite3_vtab_ptr_int *)&pVtab->zErrMsg;
  for (p_Var16 = (pVtab[2].pModule)->xNext; p_Var16 != (_func_int_sqlite3_vtab_cursor_ptr *)0x0;
      p_Var16 = *(_func_int_sqlite3_vtab_cursor_ptr **)(p_Var16 + 8)) {
    if ((*(int *)(p_Var16 + 0x20) == 1) && (*(sqlite3_vtab **)p_Var16 == pVtab)) {
      p_Var16[0x50] = (_func_int_sqlite3_vtab_cursor_ptr)((byte)p_Var16[0x50] | 0x20);
    }
  }
  uVar37 = (ulong)((*apVal)->flags & 0x3f);
  if (((0xaaaaaaaaaaaaaaaaU >> uVar37 & 1) != 0) &&
     (pVal = apVal[(long)*(int *)&psVar4->xBestIndex + 2], uVar11._0_2_ = pVal->flags,
     uVar11._2_1_ = pVal->enc, uVar11._3_1_ = pVal->eSubtype,
     (0xaaaaaaaaaaaaaaaaU >> ((ulong)uVar11 & 0x3f) & 1) == 0)) {
    pcVar17 = (char *)sqlite3ValueText(pVal,'\x01');
    if (*(int *)&psVar4->xFilter == 0) {
LAB_001c4530:
      pMVar23 = apVal[(long)*(int *)&psVar4->xBestIndex + 3];
      local_120 = 0;
      if (pcVar17 != (char *)0x0) {
        lVar18 = 0;
        do {
          bVar3 = "delete-all"[lVar18];
          if (bVar3 == pcVar17[lVar18]) {
            if ((ulong)bVar3 == 0) goto LAB_001c4679;
          }
          else if (""[bVar3] != ""[(byte)pcVar17[lVar18]]) {
            lVar18 = 0;
            goto LAB_001c469c;
          }
          lVar18 = lVar18 + 1;
        } while( true );
      }
    }
    else {
      if (pcVar17 != (char *)0x0) {
        lVar18 = 0;
        do {
          bVar3 = "secure_delete"[lVar18 + 7];
          if (bVar3 == pcVar17[lVar18]) {
            if ((ulong)bVar3 == 0) goto LAB_001c4647;
          }
          else if (""[bVar3] != ""[(byte)pcVar17[lVar18]]) goto LAB_001c4530;
          lVar18 = lVar18 + 1;
        } while( true );
      }
      pMVar23 = apVal[(long)*(int *)&psVar4->xBestIndex + 3];
    }
LAB_001c45dc:
    local_120 = 0;
    pFVar24 = *(Fts5Index **)&pVtab[1].nRef;
    pFVar21 = fts5StructureRead(pFVar24);
    fts5StructureRelease(pFVar21);
    iVar12 = pFVar24->rc;
    pFVar24->rc = 0;
    if (((iVar12 == 0) &&
        (iVar12 = sqlite3Fts5ConfigSetValue
                            ((Fts5Config *)pVtab[1].pModule,pcVar17,pMVar23,&local_120), iVar12 == 0
        )) && (iVar12 = 1, local_120 == 0)) {
      iVar12 = sqlite3Fts5StorageConfigValue((Fts5Storage *)pVtab[1].zErrMsg,pcVar17,pMVar23,0);
    }
    goto LAB_001c4c5d;
  }
  if (*(int *)&psVar4->xFilter == 0) {
    bVar38 = *(char *)(*(long *)psVar4 + 0x66) == '\x05';
    bVar39 = (0x50505050UL >> uVar37 & 1) != 0;
  }
  else {
    bVar39 = (0x50505050UL >> uVar37 & 1) != 0;
    if (*(int *)&psVar4->xFilter == 1 && bVar39) {
      pcVar17 = "DELETE from";
      if (1 < nArg) {
        pcVar17 = "UPDATE";
      }
      pcVar17 = sqlite3_mprintf("cannot %s contentless fts5 table: %s",pcVar17,psVar4->xConnect);
      pVtab->zErrMsg = pcVar17;
      local_16c = 1;
      iVar12 = local_16c;
      goto LAB_001c4c5d;
    }
    bVar38 = false;
  }
  if (nArg == 1) {
    iVar19 = sqlite3VdbeIntValue(*apVal);
    iVar12 = sqlite3Fts5StorageDelete((Fts5Storage *)pVtab[1].zErrMsg,iVar19,(sqlite3_value **)0x0);
    goto LAB_001c4c5d;
  }
  uVar11 = sqlite3_value_numeric_type(apVal[1]);
  if ((uVar11 & 0xfffffffb) != 1) {
    local_16c = 0x14;
    iVar12 = local_16c;
    goto LAB_001c4c5d;
  }
  if (bVar39) {
    iDel = sqlite3VdbeIntValue(*apVal);
    iVar19 = sqlite3VdbeIntValue(apVal[1]);
    pFVar33 = (Fts5Storage *)pVtab[1].zErrMsg;
    if (iDel == iVar19 || uVar11 != 1) {
      local_16c = sqlite3Fts5StorageDelete(pFVar33,iDel,(sqlite3_value **)0x0);
    }
    else {
      if (!bVar38) {
        local_16c = sqlite3Fts5StorageContentInsert(pFVar33,apVal,pRowid);
        iVar12 = local_16c;
        if ((local_16c == 0) &&
           (local_16c = sqlite3Fts5StorageDelete
                                  ((Fts5Storage *)pVtab[1].zErrMsg,iDel,(sqlite3_value **)0x0),
           iVar12 = local_16c, local_16c == 0)) {
          iVar12 = sqlite3Fts5StorageIndexInsert((Fts5Storage *)pVtab[1].zErrMsg,apVal,*pRowid);
        }
        goto LAB_001c4c5d;
      }
      local_16c = sqlite3Fts5StorageDelete(pFVar33,iDel,(sqlite3_value **)0x0);
      if (local_16c == 0) {
        pFVar33 = (Fts5Storage *)pVtab[1].zErrMsg;
        local_16c = 0;
        goto LAB_001c45ba;
      }
    }
  }
  else if (bVar38 && uVar11 == 1) {
    iVar19 = sqlite3VdbeIntValue(apVal[1]);
    pFVar33 = (Fts5Storage *)pVtab[1].zErrMsg;
LAB_001c45ba:
    local_16c = sqlite3Fts5StorageDelete(pFVar33,iVar19,(sqlite3_value **)0x0);
  }
  fts5StorageInsert(&local_16c,(Fts5FullTable *)pVtab,apVal,pRowid);
  iVar12 = local_16c;
  goto LAB_001c4c5d;
LAB_001c469c:
  bVar3 = "rebuild"[lVar18];
  if (bVar3 == pcVar17[lVar18]) {
    if ((ulong)bVar3 == 0) goto LAB_001c46fa;
  }
  else if (""[bVar3] != ""[(byte)pcVar17[lVar18]]) {
    lVar18 = 0;
    goto LAB_001c4716;
  }
  lVar18 = lVar18 + 1;
  goto LAB_001c469c;
LAB_001c4716:
  bVar3 = "optimize"[lVar18];
  if (bVar3 == pcVar17[lVar18]) {
    if ((ulong)bVar3 == 0) goto LAB_001c47de;
  }
  else if (""[bVar3] != ""[(byte)pcVar17[lVar18]]) {
    lVar18 = 0;
    goto LAB_001c48b6;
  }
  lVar18 = lVar18 + 1;
  goto LAB_001c4716;
LAB_001c48b6:
  bVar3 = "automerge"[lVar18 + 4];
  if (bVar3 == pcVar17[lVar18]) {
    if ((ulong)bVar3 == 0) goto LAB_001c48ea;
  }
  else if (""[bVar3] != ""[(byte)pcVar17[lVar18]]) {
    lVar18 = 0;
    goto LAB_001c49b5;
  }
  lVar18 = lVar18 + 1;
  goto LAB_001c48b6;
LAB_001c49b5:
  bVar3 = "integrity-check"[lVar18];
  if (bVar3 == pcVar17[lVar18]) {
    if ((ulong)bVar3 == 0) goto LAB_001c4a28;
  }
  else if (""[bVar3] != ""[(byte)pcVar17[lVar18]]) goto LAB_001c45dc;
  lVar18 = lVar18 + 1;
  goto LAB_001c49b5;
code_r0x001c4ec5:
  piVar1 = local_168->aTotalSize + uVar28;
  lVar18 = uVar28 * 8;
  uVar28 = uVar28 + 1;
  if (*piVar1 != *(long *)((long)local_130 + lVar18)) goto LAB_001c4aac;
  goto LAB_001c4ec0;
LAB_001c48ea:
  iVar19 = sqlite3VdbeIntValue(pMVar23);
  iVar12 = (int)iVar19;
  pFVar24 = *(Fts5Index **)(pVtab[1].zErrMsg + 8);
  pFVar21 = fts5StructureRead(pFVar24);
  if (pFVar21 != (Fts5Structure *)0x0) {
    iVar13 = pFVar24->pConfig->nUsermerge;
    buf.p = (u8 *)pFVar21;
    if (pFVar24->pStruct != (Fts5Structure *)0x0) {
      fts5StructureRelease(pFVar24->pStruct);
      pFVar24->pStruct = (Fts5Structure *)0x0;
    }
    if (iVar12 < 0) {
      pFVar20 = fts5IndexOptimizeStruct(pFVar24,pFVar21);
      fts5StructureRelease(pFVar21);
      buf.p = (u8 *)pFVar20;
      if (pFVar20 == (Fts5Structure *)0x0) {
        pFVar21 = (Fts5Structure *)0x0;
        goto LAB_001c4c48;
      }
      iVar12 = -iVar12;
      iVar13 = 2;
      pFVar21 = pFVar20;
    }
    if ((pFVar21->nLevel != 0) &&
       (iVar12 = fts5IndexMerge(pFVar24,(Fts5Structure **)&buf,iVar12,iVar13),
       pFVar21 = (Fts5Structure *)buf.p, iVar12 != 0)) {
      fts5StructureWrite(pFVar24,(Fts5Structure *)buf.p);
    }
LAB_001c4c48:
    fts5StructureRelease(pFVar21);
  }
  goto LAB_001c4c4d;
LAB_001c47de:
  pFVar24 = *(Fts5Index **)(pVtab[1].zErrMsg + 8);
  fts5IndexFlush(pFVar24);
  pFVar20 = fts5StructureRead(pFVar24);
  if (pFVar24->pStruct != (Fts5Structure *)0x0) {
    fts5StructureRelease(pFVar24->pStruct);
    pFVar24->pStruct = (Fts5Structure *)0x0;
  }
  if (pFVar20 != (Fts5Structure *)0x0) {
    pFVar21 = fts5IndexOptimizeStruct(pFVar24,pFVar20);
    buf.p = (u8 *)pFVar21;
    fts5StructureRelease(pFVar20);
    if (pFVar21 != (Fts5Structure *)0x0) {
      iVar12 = -1;
      lVar18 = 0x1c;
      do {
        lVar32 = lVar18;
        iVar12 = iVar12 + 1;
        lVar18 = lVar32 + 0x10;
      } while (*(int *)((long)pFVar21->aLevel + lVar32 + -0x18) == 0);
      if (pFVar24->rc == 0) {
        do {
          pFVar21 = (Fts5Structure *)buf.p;
          if (*(int *)(buf.p + lVar32) < 1) break;
          nRow = CONCAT44(nRow._4_4_,1000);
          fts5IndexMergeLevel(pFVar24,(Fts5Structure **)&buf,iVar12,(int *)&nRow);
          pFVar21 = (Fts5Structure *)buf.p;
        } while (pFVar24->rc == 0);
      }
      fts5StructureWrite(pFVar24,pFVar21);
      goto LAB_001c4c48;
    }
  }
LAB_001c4c4d:
  iVar12 = pFVar24->rc;
  pFVar24->rc = 0;
  goto LAB_001c4c5d;
LAB_001c46fa:
  if (*(int *)&(pVtab[1].pModule)->xFilter != 1) {
    pFVar33 = (Fts5Storage *)pVtab[1].zErrMsg;
    buf.p = (u8 *)0x0;
    buf.n = 0;
    buf.nSpace = 0;
    pFVar5 = pFVar33->pConfig;
    iPos = 0;
    uStack_150 = 0;
    nRow = (i64)pFVar33;
    iVar13 = sqlite3Fts5StorageDeleteAll(pFVar33);
    if ((iVar13 == 0) && (iVar13 = fts5StorageLoadTotals(pFVar33,1), iVar13 == 0)) {
      iVar13 = fts5StorageGetStmt(pFVar33,10,(sqlite3_stmt **)&iPos,(char **)0x0);
      psVar35 = (sqlite3_stmt *)iPos;
      if (iVar13 == 0) {
        do {
          iVar12 = sqlite3_step(psVar35);
          bVar39 = iVar12 != 100;
          if (bVar39) {
            iVar13 = 0;
            bVar39 = true;
            puVar26 = buf.p;
            break;
          }
          pMVar23 = columnMem(psVar35,0);
          pFVar24 = (Fts5Index *)sqlite3VdbeIntValue(pMVar23);
          columnMallocFailure(psVar35);
          buf._8_8_ = buf._8_8_ & 0xffffffff00000000;
          local_160 = pFVar24;
          iVar13 = sqlite3Fts5IndexBeginWrite(pFVar33->pIndex,0,(i64)pFVar24);
          local_b8.p = (u8 *)CONCAT44(local_b8.p._4_4_,iVar13);
          uStack_150 = uStack_150 & 0xffffffff00000000;
          if (iVar13 != 0) {
LAB_001c4c31:
            pFVar33->nTotalRow = pFVar33->nTotalRow + 1;
            bVar39 = false;
            puVar26 = buf.p;
            break;
          }
          iVar12 = 0;
          while (iVar12 < pFVar5->nCol) {
            uStack_150 = uStack_150 & 0xffffffff;
            if (pFVar5->abUnindexed[iVar12] == '\0') {
              puVar25 = sqlite3_column_text(psVar35,iVar12 + 1);
              iVar12 = sqlite3_column_bytes(psVar35,(u32)uStack_150 + 1);
              if (puVar25 == (uchar *)0x0) {
                iVar12 = 0;
              }
              else {
                iVar12 = (*pFVar5->pTokApi->xTokenize)
                                   (pFVar5->pTok,&nRow,4,(char *)puVar25,iVar12,
                                    fts5StorageInsertCallback);
              }
              local_b8.p = (u8 *)CONCAT44(local_b8.p._4_4_,iVar12);
              iVar19 = (i64)uStack_150._4_4_;
            }
            else {
              iVar19 = 0;
            }
            sqlite3Fts5BufferAppendVarint((int *)&local_b8,&buf,iVar19);
            pFVar33->aTotalSize[(int)(u32)uStack_150] =
                 pFVar33->aTotalSize[(int)(u32)uStack_150] + (long)uStack_150._4_4_;
            iVar12 = (u32)uStack_150 + 1;
            uStack_150 = CONCAT44(uStack_150._4_4_,iVar12);
            iVar13 = (int)local_b8.p;
            if ((int)local_b8.p != 0) goto LAB_001c4c31;
          }
          pFVar33->nTotalRow = pFVar33->nTotalRow + 1;
          iVar13 = fts5StorageInsertDocsize(pFVar33,(i64)local_160,&buf);
          local_b8.p = (u8 *)CONCAT44(local_b8.p._4_4_,iVar13);
          puVar26 = buf.p;
        } while (iVar13 == 0);
      }
      else {
        bVar39 = false;
        puVar26 = (u8 *)0x0;
      }
    }
    else {
      psVar35 = (sqlite3_stmt *)0x0;
      bVar39 = false;
      puVar26 = (u8 *)0x0;
    }
    sqlite3_free(puVar26);
    iVar12 = sqlite3_reset(psVar35);
    if (!bVar39) {
      iVar12 = iVar13;
    }
    if (iVar12 == 0) {
      iVar12 = fts5StorageSaveTotals(pFVar33);
    }
    goto LAB_001c4c5d;
  }
  pcVar17 = "\'rebuild\' may not be used with a contentless fts5 table";
  goto LAB_001c4748;
LAB_001c4679:
  if (*(int *)&(pVtab[1].pModule)->xFilter != 0) {
    iVar12 = sqlite3Fts5StorageDeleteAll((Fts5Storage *)pVtab[1].zErrMsg);
    goto LAB_001c4c5d;
  }
  pcVar17 = "\'delete-all\' may only be used with a contentless or external content fts5 table";
LAB_001c4748:
  fts5SetVtabError((Fts5FullTable *)pVtab,pcVar17);
  iVar12 = 1;
  goto LAB_001c4c5d;
LAB_001c4647:
  pMVar23 = apVal[1];
  uVar36._0_2_ = pMVar23->flags;
  uVar36._2_1_ = pMVar23->enc;
  uVar36._3_1_ = pMVar23->eSubtype;
  iVar12 = 0;
  if ((0x50505050UL >> ((ulong)uVar36 & 0x3f) & 1) != 0) {
    iVar19 = sqlite3VdbeIntValue(pMVar23);
    iVar12 = sqlite3Fts5StorageDelete((Fts5Storage *)pVtab[1].zErrMsg,iVar19,apVal + 2);
  }
  goto LAB_001c4c5d;
LAB_001c4a28:
  pFVar33 = (Fts5Storage *)pVtab[1].zErrMsg;
  pFVar5 = pFVar33->pConfig;
  buf.p = (u8 *)0x0;
  buf.n = 0;
  buf.nSpace = 0;
  iVar13 = pFVar5->nCol;
  iVar14 = sqlite3_initialize();
  iVar12 = 7;
  if ((iVar14 == 0) && (pvVar22 = sqlite3Malloc((long)iVar13 * 0xc), pvVar22 != (void *)0x0)) {
    iVar13 = pFVar5->nCol;
    memset(pvVar22,0,(long)iVar13 * 8);
    iVar12 = fts5StorageGetStmt(pFVar33,10,&pScan,(char **)0x0);
    if (iVar12 == 0) {
      iVar12 = sqlite3_step(pScan);
      pFVar24 = (Fts5Index *)pScan;
      local_168 = pFVar33;
      if (iVar12 == 100) {
        local_140 = (Fts5Iter *)((long)iVar13 * 8 + (long)pvVar22);
        local_160 = (Fts5Index *)pScan;
        local_130 = pvVar22;
        do {
          pFStack_100 = (Fts5Termset *)0x0;
          pMVar23 = columnMem((sqlite3_stmt *)pFVar24,0);
          puVar26 = (u8 *)sqlite3VdbeIntValue(pMVar23);
          columnMallocFailure((sqlite3_stmt *)pFVar24);
          buf._8_8_ = buf._8_8_ & 0xffffffff;
          buf.p = puVar26;
          if ((pFVar5->bColumnsize != 0) &&
             (iVar12 = sqlite3Fts5StorageDocsize(pFVar33,(i64)puVar26,(int *)local_140), iVar12 != 0
             )) {
LAB_001c56c6:
            sqlite3Fts5TermsetFree(pFStack_100);
            sqlite3_reset((sqlite3_stmt *)local_160);
            goto LAB_001c4aac;
          }
          if (pFVar5->eDetail == 1) {
            nRow = nRow & 0xffffffff00000000;
            pFStack_100 = (Fts5Termset *)sqlite3Fts5MallocZero((int *)&nRow,0x1000);
            iVar12 = (int)nRow;
            if ((int)nRow != 0) goto LAB_001c56c6;
          }
          uVar37 = 0;
          while ((long)uVar37 < (long)pFVar5->nCol) {
            iVar12 = 0;
            if (pFVar5->abUnindexed[uVar37] == '\0') {
              buf._8_8_ = uVar37 & 0xffffffff;
              if (pFVar5->eDetail == 2) {
                nRow = nRow & 0xffffffff00000000;
                pFStack_100 = (Fts5Termset *)sqlite3Fts5MallocZero((int *)&nRow,0x1000);
                iVar12 = (int)nRow;
                if ((int)nRow == 0) goto LAB_001c4d94;
              }
              else {
LAB_001c4d94:
                pFVar24 = local_160;
                iVar12 = (int)uVar37 + 1;
                puVar25 = sqlite3_column_text((sqlite3_stmt *)local_160,iVar12);
                pvVar22 = local_130;
                pFVar33 = local_168;
                iVar12 = sqlite3_column_bytes((sqlite3_stmt *)pFVar24,iVar12);
                if ((puVar25 == (uchar *)0x0) ||
                   (iVar12 = (*pFVar5->pTokApi->xTokenize)
                                       (pFVar5->pTok,&buf,4,(char *)puVar25,iVar12,
                                        fts5StorageIntegrityCallback), iVar12 == 0)) {
                  if (pFVar5->bColumnsize == 0) {
                    iVar12 = 0;
                  }
                  else {
                    iVar12 = 0x10b;
                    if (buf.nSpace == *(int *)((long)local_140->aSeg + uVar37 * 4 + -0x60)) {
                      iVar12 = 0;
                    }
                  }
                }
              }
              plVar2 = (long *)((long)pvVar22 + uVar37 * 8);
              *plVar2 = *plVar2 + (long)buf.nSpace;
              if (pFVar5->eDetail == 2) {
                sqlite3Fts5TermsetFree(pFStack_100);
                pFStack_100 = (Fts5Termset *)0x0;
              }
            }
            uVar37 = uVar37 + 1;
            if (iVar12 != 0) goto LAB_001c56c6;
          }
          sqlite3Fts5TermsetFree(pFStack_100);
          pFVar24 = local_160;
          iVar12 = sqlite3_step((sqlite3_stmt *)local_160);
        } while (iVar12 == 100);
      }
      iVar12 = sqlite3_reset((sqlite3_stmt *)pFVar24);
      if (iVar12 == 0) {
        local_130 = pvVar22;
        iVar12 = fts5StorageLoadTotals(pFVar33,0);
        pvVar22 = local_130;
        if (iVar12 == 0) {
          uVar37 = (ulong)(uint)pFVar5->nCol;
          if (pFVar5->nCol < 1) {
            uVar37 = 0;
          }
          iVar12 = 0x10b;
          uVar28 = 0;
LAB_001c4ec0:
          if (uVar37 != uVar28) goto code_r0x001c4ec5;
          if (pFVar5->eContent == 0) {
            nRow = 0;
            iVar12 = fts5StorageCount((Fts5Storage *)local_168->pConfig,"content",&nRow);
            pvVar22 = local_130;
            if ((iVar12 != 0) || (iVar12 = 0x10b, nRow != local_168->nTotalRow)) goto LAB_001c4aac;
          }
          if (pFVar5->bColumnsize != 0) {
            nRow = 0;
            iVar12 = fts5StorageCount((Fts5Storage *)local_168->pConfig,"docsize",&nRow);
            pvVar22 = local_130;
            if ((iVar12 != 0) || (iVar12 = 0x10b, nRow != local_168->nTotalRow)) goto LAB_001c4aac;
          }
          local_160 = local_168->pIndex;
          local_58 = 0;
          local_70 = local_160->pConfig->eDetail;
          local_b8.p = (u8 *)0x0;
          local_b8.n = 0;
          local_b8.nSpace = 0;
          local_d0 = fts5StructureRead(local_160);
          if (local_d0 == (Fts5Structure *)0x0) {
            pFVar21 = (Fts5Structure *)0x0;
          }
          else {
            iVar12 = local_d0->nLevel;
            pFVar21 = local_d0;
            if (0 < iVar12) {
              local_60 = local_d0->aLevel;
              local_168 = (Fts5Storage *)&local_160->rc;
              local_80 = 0;
              do {
                if (0 < local_60[local_80].nSeg) {
                  pFVar31 = local_60 + local_80;
                  lVar18 = 0;
                  pFVar24 = local_160;
                  pFVar33 = local_168;
                  local_50 = pFVar31;
                  do {
                    pStmt = (sqlite3_stmt *)0x0;
                    iVar12 = pFVar31->aSeg[lVar18].pgnoFirst;
                    if (iVar12 != 0) {
                      local_138 = pFVar31->aSeg + lVar18;
                      uVar37 = (ulong)(uint)local_138->pgnoLast;
                      local_48 = lVar18;
                      pcVar17 = sqlite3_mprintf("SELECT segid, term, (pgno>>1), (pgno&1) FROM %Q.\'%q_idx\' WHERE segid=%d"
                                                ,pFVar24->pConfig->zDb,pFVar24->pConfig->zName,
                                                (ulong)(uint)local_138->iSegid);
                      fts5IndexPrepareStmt(pFVar24,&pStmt,pcVar17);
                      psVar35 = pStmt;
                      if (pFVar24->rc == 0) {
                        iVar12 = iVar12 + -1;
                        local_98 = pStmt;
                        do {
                          iVar13 = sqlite3_step(psVar35);
                          if (iVar13 != 100) break;
                          local_140 = (Fts5Iter *)CONCAT44(local_140._4_4_,iVar12);
                          iVar12 = sqlite3_column_bytes(psVar35,1);
                          local_78 = CONCAT44(local_78._4_4_,iVar12);
                          local_a0 = sqlite3_column_text(psVar35,1);
                          pMVar23 = columnMem(psVar35,2);
                          uVar28 = sqlite3VdbeIntValue(pMVar23);
                          columnMallocFailure(psVar35);
                          pMVar23 = columnMem(psVar35,3);
                          local_40 = sqlite3VdbeIntValue(pMVar23);
                          columnMallocFailure(psVar35);
                          if ((int)uVar28 < local_138->pgnoFirst) {
                            iVar12 = (int)local_140;
                          }
                          else {
                            local_88 = uVar28;
                            pFVar27 = fts5LeafRead(pFVar24,(long)(int)uVar28 +
                                                           ((ulong)(uint)local_138->iSegid << 0x25))
                            ;
                            if (pFVar27 == (Fts5Data *)0x0) break;
                            iVar12 = pFVar27->szLeaf;
                            if (iVar12 < pFVar27->nn) {
                              puVar6 = (ushort *)pFVar27->p;
                              local_90 = pFVar27;
                              sqlite3Fts5GetVarint32
                                        ((uchar *)((long)puVar6 + (long)iVar12),(u32 *)&nRow);
                              iVar13 = (int)nRow;
                              if (((int)nRow < iVar12) &&
                                 ((int)(uint)(ushort)(*puVar6 << 8 | *puVar6 >> 8) < (int)nRow)) {
                                iVar15 = sqlite3Fts5GetVarint32
                                                   ((uchar *)((long)puVar6 + (nRow & 0xffffffffU)),
                                                    (u32 *)&nTerm);
                                iVar30 = nTerm - (int)local_78;
                                iVar14 = nTerm;
                                if ((int)local_78 <= nTerm) {
                                  iVar14 = (int)local_78;
                                }
                                if ((iVar14 != 0) &&
                                   (iVar13 = memcmp((void *)((long)puVar6 +
                                                            (ulong)(uint)(iVar15 + iVar13)),local_a0
                                                    ,(long)iVar14), iVar13 != 0)) {
                                  iVar30 = iVar13;
                                }
                                if (iVar30 < 0) goto LAB_001c5438;
                                nRow = 0;
                                uStack_150 = 0;
                                iPos = 0;
                                uStack_e0 = 0;
                                if (*(int *)&local_168->pConfig != 0) goto LAB_001c5443;
                                iVar13 = 0;
                                uVar34 = 0;
                                do {
                                  local_a0 = local_90->p;
                                  iVar30 = sqlite3Fts5GetVarint32(local_a0 + iVar12,(u32 *)&nIncr);
                                  puVar25 = local_a0;
                                  local_78 = (long)iVar13 + (long)nIncr;
                                  iVar14 = local_90->szLeaf;
                                  iVar15 = (int)local_78;
                                  if (iVar15 < iVar14) {
                                    local_124 = iVar30;
                                    local_bc = iVar14;
                                    if (iVar13 == 0) {
                                      iVar13 = sqlite3Fts5GetVarint32
                                                         (local_a0 + local_78,(u32 *)&nKeep);
                                      pFVar33 = local_168;
                                      if (local_bc < iVar13 + iVar15 + nKeep) {
                                        *(undefined4 *)&local_168->pConfig = 0x10b;
                                        iVar30 = local_124;
                                      }
                                      else {
                                        uStack_150 = uStack_150 & 0xffffffff00000000;
                                        sqlite3Fts5BufferAppendBlob
                                                  ((int *)local_168,(Fts5Buffer *)&nRow,nKeep,
                                                   puVar25 + (iVar13 + iVar15));
                                        iVar30 = local_124;
                                      }
                                    }
                                    else {
                                      iVar13 = sqlite3Fts5GetVarint32
                                                         (local_a0 + iVar15,(u32 *)&nKeep);
                                      iVar14 = sqlite3Fts5GetVarint32
                                                         (puVar25 + (iVar13 + iVar15),&local_68);
                                      pFVar8 = local_168;
                                      if (((int)uVar34 < nKeep) ||
                                         (iVar14 = iVar13 + iVar15 + iVar14,
                                         local_bc < (int)(local_68 + iVar14))) {
LAB_001c52e8:
                                        *(undefined4 *)&local_168->pConfig = 0x10b;
                                        pFVar33 = local_168;
                                        iVar30 = local_124;
                                      }
                                      else {
                                        uStack_150 = CONCAT44(uStack_150._4_4_,nKeep);
                                        sqlite3Fts5BufferAppendBlob
                                                  ((int *)local_168,(Fts5Buffer *)&nRow,local_68,
                                                   puVar25 + iVar14);
                                        pFVar33 = local_168;
                                        iVar30 = local_124;
                                        if (*(int *)&pFVar8->pConfig == 0) {
                                          iVar14 = (u32)uStack_150 - (int)uStack_e0;
                                          iVar13 = (int)uStack_e0;
                                          if ((int)(u32)uStack_150 < (int)uStack_e0) {
                                            iVar13 = (u32)uStack_150;
                                          }
                                          if ((iVar13 == 0) ||
                                             (iVar13 = memcmp((void *)nRow,(void *)iPos,(long)iVar13
                                                             ), iVar13 == 0)) {
                                            iVar13 = iVar14;
                                          }
                                          pFVar33 = local_168;
                                          iVar30 = local_124;
                                          if (iVar13 < 1) goto LAB_001c52e8;
                                        }
                                      }
                                    }
                                  }
                                  else {
                                    *(undefined4 *)&local_168->pConfig = 0x10b;
                                    pFVar33 = local_168;
                                  }
                                  pvVar22 = (void *)nRow;
                                  iVar12 = iVar12 + iVar30;
                                  uVar34 = (u32)uStack_150;
                                  uStack_e0 = uStack_e0 & 0xffffffff00000000;
                                  sqlite3Fts5BufferAppendBlob
                                            ((int *)pFVar33,(Fts5Buffer *)&iPos,(u32)uStack_150,
                                             (u8 *)nRow);
                                  p = (void *)iPos;
                                } while ((iVar12 < local_90->nn) &&
                                        (iVar13 = (int)local_78, *(int *)&pFVar33->pConfig == 0));
                              }
                              else {
LAB_001c5438:
                                *(undefined4 *)&local_168->pConfig = 0x10b;
LAB_001c5443:
                                pvVar22 = (void *)0x0;
                                p = (void *)0x0;
                              }
                              sqlite3_free(pvVar22);
                              sqlite3_free(p);
                              pFVar27 = local_90;
                              pFVar24 = local_160;
                              pFVar33 = local_168;
                              iVar12 = (int)local_140;
                            }
                            else {
                              *(undefined4 *)&pFVar33->pConfig = 0x10b;
                              iVar12 = (int)local_140;
                            }
                            psVar35 = local_98;
                            sqlite3_free(pFVar27);
                            pFVar9 = local_138;
                            if (*(int *)&pFVar33->pConfig != 0) break;
                            iVar13 = (int)local_88 + -1;
                            if (iVar12 < iVar13) {
                              lVar18 = (long)(iVar12 + 1);
                              do {
                                pFVar27 = fts5DataRead(local_160,
                                                       ((ulong)(uint)pFVar9->iSegid << 0x25) +
                                                       lVar18);
                                if (pFVar27 != (Fts5Data *)0x0) {
                                  if (pFVar27->szLeaf < pFVar27->nn) {
                                    *(undefined4 *)&pFVar33->pConfig = 0x10b;
                                  }
                                  if (((int)uVar37 + 1 <= lVar18) &&
                                     (pFVar27->p[1] != '\0' || *pFVar27->p != '\0')) {
                                    *(undefined4 *)&pFVar33->pConfig = 0x10b;
                                  }
                                }
                                sqlite3_free(pFVar27);
                              } while ((lVar18 < iVar13) &&
                                      (lVar18 = lVar18 + 1, *(int *)&pFVar33->pConfig == 0));
                              pFVar24 = local_160;
                              psVar35 = local_98;
                              if (*(int *)&pFVar33->pConfig != 0) break;
                            }
                            iVar12 = (int)local_88;
                            if ((int)local_40 == 0) {
                              uVar37 = (ulong)(uint)local_138->pgnoLast;
                            }
                            else {
                              uVar11 = local_138->iSegid;
                              uVar37 = 0;
                              pIter = fts5DlidxIterInit(pFVar24,0,uVar11,iVar12);
                              if ((pFVar24->rc == 0) && (pIter->aLvl[0].bEof == 0)) {
                                lVar18 = (ulong)uVar11 << 0x25;
                                uVar28 = local_88 & 0xffffffff;
                                do {
                                  uVar36 = (int)uVar28 + 1;
                                  uVar37 = (ulong)uVar36;
                                  uVar11 = pIter->aLvl[0].iLeafPgno;
                                  if ((int)uVar36 < (int)uVar11) {
                                    uVar37 = (ulong)(int)uVar36;
                                    do {
                                      pFVar27 = fts5DataRead(pFVar24,lVar18 + uVar37);
                                      if (pFVar27 != (Fts5Data *)0x0) {
                                        if (pFVar27->p[1] != '\0' || *pFVar27->p != '\0') {
                                          *(undefined4 *)&local_168->pConfig = 0x10b;
                                        }
                                        sqlite3_free(pFVar27);
                                      }
                                      uVar37 = uVar37 + 1;
                                      uVar11 = pIter->aLvl[0].iLeafPgno;
                                      lVar32 = (long)(int)uVar11;
                                    } while ((long)uVar37 < lVar32);
                                  }
                                  else {
                                    lVar32 = (long)(int)uVar11;
                                  }
                                  uVar28 = (ulong)uVar11;
                                  pFVar27 = fts5DataRead(pFVar24,lVar32 + lVar18);
                                  if (pFVar27 != (Fts5Data *)0x0) {
                                    uVar10 = *(ushort *)pFVar27->p;
                                    uVar10 = uVar10 << 8 | uVar10 >> 8;
                                    if ((pFVar27->szLeaf <= (int)(uint)uVar10) ||
                                       (sqlite3Fts5GetVarint
                                                  ((uchar *)((long)pFVar27->p + (ulong)uVar10),
                                                   (u64 *)&nRow), nRow != pIter->aLvl[0].iRowid)) {
                                      *(undefined4 *)&local_168->pConfig = 0x10b;
                                    }
                                    sqlite3_free(pFVar27);
                                  }
                                  pFVar24 = local_160;
                                  fts5DlidxIterNextR(local_160,pIter,0);
                                } while ((pFVar24->rc == 0) && (pIter->aLvl[0].bEof == 0));
                              }
                              fts5DlidxIterFree(pIter);
                              iVar12 = (int)local_88;
                              pFVar33 = local_168;
                              psVar35 = local_98;
                            }
                          }
                        } while (*(int *)&pFVar33->pConfig == 0);
                      }
                      iVar12 = sqlite3_finalize(psVar35);
                      pFVar31 = local_50;
                      lVar18 = local_48;
                      if (*(int *)&pFVar33->pConfig == 0) {
                        *(int *)&pFVar33->pConfig = iVar12;
                      }
                    }
                    lVar18 = lVar18 + 1;
                  } while (lVar18 < pFVar31->nSeg);
                  iVar12 = local_d0->nLevel;
                }
                local_80 = local_80 + 1;
                pFVar21 = local_d0;
              } while (local_80 < iVar12);
            }
          }
          fts5MultiIterNew(local_160,pFVar21,0x20,(Fts5Colset *)0x0,(u8 *)0x0,0,-1,0,
                           (Fts5Iter **)&nRow);
          local_140 = (Fts5Iter *)nRow;
          if (local_160->rc == 0) {
            local_138 = (Fts5StructureSegment *)(nRow + 0x60);
            uVar37 = 0;
            do {
              if ((local_140->base).bEof != '\0') break;
              iPos = 0;
              pStmt = (sqlite3_stmt *)((ulong)pStmt & 0xffffffff00000000);
              uVar28 = (ulong)local_140->aFirst[1].iFirst;
              lVar18 = *(long *)&local_138[uVar28 * 10 + 8].pgnoLast;
              uVar11 = local_138[uVar28 * 10 + 8].iSegid;
              lVar32 = *(long *)&local_138[uVar28 * 10 + 7].pgnoFirst;
              if (local_70 == 1) {
                lVar7._0_4_ = local_138[uVar28 * 10 + 1].pgnoFirst;
                lVar7._4_4_ = local_138[uVar28 * 10 + 1].pgnoLast;
                if ((lVar7 == 0) || (local_138[uVar28 * 10 + 9].pgnoFirst != 0)) {
                  uVar28 = lVar18 * 0x51;
                  if (0 < (int)uVar11) {
                    uVar29 = 0;
                    do {
                      uVar28 = uVar28 * 9 + (long)*(char *)(lVar32 + uVar29);
                      uVar29 = uVar29 + 1;
                    } while (uVar11 != uVar29);
                  }
                  uVar37 = uVar37 ^ uVar28;
                }
              }
              else {
                local_b8._8_8_ = local_b8._8_8_ & 0xffffffff00000000;
                fts5SegiterPoslist(local_160,(Fts5SegIter *)(local_138 + uVar28 * 10),
                                   (Fts5Colset *)0x0,&local_b8);
                iVar12 = local_b8.n;
                local_168 = (Fts5Storage *)local_b8.p;
                iVar13 = sqlite3Fts5PoslistNext64(local_b8.p,local_b8.n,(int *)&pStmt,&iPos);
                if (iVar13 == 0) {
                  do {
                    uVar28 = (ulong)((uint)iPos & 0x7fffffff) + ((iPos >> 0x20) + lVar18 * 9) * 9;
                    if (0 < (int)uVar11) {
                      uVar29 = 0;
                      do {
                        uVar28 = uVar28 * 9 + (long)*(char *)(lVar32 + uVar29);
                        uVar29 = uVar29 + 1;
                      } while (uVar11 != uVar29);
                    }
                    uVar37 = uVar37 ^ uVar28;
                    iVar13 = sqlite3Fts5PoslistNext64((u8 *)local_168,iVar12,(int *)&pStmt,&iPos);
                  } while (iVar13 == 0);
                }
              }
              pFVar24 = local_160;
              fts5MultiIterNext(local_160,local_140,0,0);
            } while (pFVar24->rc == 0);
          }
          else {
            uVar37 = 0;
          }
          fts5MultiIterFree(local_140);
          if ((local_160->rc == 0) && (uVar37 != local_58)) {
            local_160->rc = 0x10b;
          }
          fts5StructureRelease(local_d0);
          sqlite3_free(local_b8.p);
          iVar12 = local_160->rc;
          local_160->rc = 0;
          pvVar22 = local_130;
        }
      }
    }
LAB_001c4aac:
    sqlite3_free(pvVar22);
  }
LAB_001c4c5d:
  local_16c = iVar12;
  (pVtab[1].pModule)->xSavepoint = (_func_int_sqlite3_vtab_ptr_int *)0x0;
  return local_16c;
}

Assistant:

static int fts5UpdateMethod(
  sqlite3_vtab *pVtab,            /* Virtual table handle */
  int nArg,                       /* Size of argument array */
  sqlite3_value **apVal,          /* Array of arguments */
  sqlite_int64 *pRowid            /* OUT: The affected (or effected) rowid */
){
  Fts5FullTable *pTab = (Fts5FullTable*)pVtab;
  Fts5Config *pConfig = pTab->p.pConfig;
  int eType0;                     /* value_type() of apVal[0] */
  int rc = SQLITE_OK;             /* Return code */

  /* A transaction must be open when this is called. */
  assert( pTab->ts.eState==1 );

  assert( pVtab->zErrMsg==0 );
  assert( nArg==1 || nArg==(2+pConfig->nCol+2) );
  assert( sqlite3_value_type(apVal[0])==SQLITE_INTEGER 
       || sqlite3_value_type(apVal[0])==SQLITE_NULL 
  );
  assert( pTab->p.pConfig->pzErrmsg==0 );
  pTab->p.pConfig->pzErrmsg = &pTab->p.base.zErrMsg;

  /* Put any active cursors into REQUIRE_SEEK state. */
  fts5TripCursors(pTab);

  eType0 = sqlite3_value_type(apVal[0]);
  if( eType0==SQLITE_NULL 
   && sqlite3_value_type(apVal[2+pConfig->nCol])!=SQLITE_NULL 
  ){
    /* A "special" INSERT op. These are handled separately. */
    const char *z = (const char*)sqlite3_value_text(apVal[2+pConfig->nCol]);
    if( pConfig->eContent!=FTS5_CONTENT_NORMAL 
      && 0==sqlite3_stricmp("delete", z) 
    ){
      rc = fts5SpecialDelete(pTab, apVal);
    }else{
      rc = fts5SpecialInsert(pTab, z, apVal[2 + pConfig->nCol + 1]);
    }
  }else{
    /* A regular INSERT, UPDATE or DELETE statement. The trick here is that
    ** any conflict on the rowid value must be detected before any 
    ** modifications are made to the database file. There are 4 cases:
    **
    **   1) DELETE
    **   2) UPDATE (rowid not modified)
    **   3) UPDATE (rowid modified)
    **   4) INSERT
    **
    ** Cases 3 and 4 may violate the rowid constraint.
    */
    int eConflict = SQLITE_ABORT;
    if( pConfig->eContent==FTS5_CONTENT_NORMAL ){
      eConflict = sqlite3_vtab_on_conflict(pConfig->db);
    }

    assert( eType0==SQLITE_INTEGER || eType0==SQLITE_NULL );
    assert( nArg!=1 || eType0==SQLITE_INTEGER );

    /* Filter out attempts to run UPDATE or DELETE on contentless tables.
    ** This is not suported.  */
    if( eType0==SQLITE_INTEGER && fts5IsContentless(pTab) ){
      pTab->p.base.zErrMsg = sqlite3_mprintf(
          "cannot %s contentless fts5 table: %s", 
          (nArg>1 ? "UPDATE" : "DELETE from"), pConfig->zName
      );
      rc = SQLITE_ERROR;
    }

    /* DELETE */
    else if( nArg==1 ){
      i64 iDel = sqlite3_value_int64(apVal[0]);  /* Rowid to delete */
      rc = sqlite3Fts5StorageDelete(pTab->pStorage, iDel, 0);
    }

    /* INSERT or UPDATE */
    else{
      int eType1 = sqlite3_value_numeric_type(apVal[1]);

      if( eType1!=SQLITE_INTEGER && eType1!=SQLITE_NULL ){
        rc = SQLITE_MISMATCH;
      }

      else if( eType0!=SQLITE_INTEGER ){     
        /* If this is a REPLACE, first remove the current entry (if any) */
        if( eConflict==SQLITE_REPLACE && eType1==SQLITE_INTEGER ){
          i64 iNew = sqlite3_value_int64(apVal[1]);  /* Rowid to delete */
          rc = sqlite3Fts5StorageDelete(pTab->pStorage, iNew, 0);
        }
        fts5StorageInsert(&rc, pTab, apVal, pRowid);
      }

      /* UPDATE */
      else{
        i64 iOld = sqlite3_value_int64(apVal[0]);  /* Old rowid */
        i64 iNew = sqlite3_value_int64(apVal[1]);  /* New rowid */
        if( eType1==SQLITE_INTEGER && iOld!=iNew ){
          if( eConflict==SQLITE_REPLACE ){
            rc = sqlite3Fts5StorageDelete(pTab->pStorage, iOld, 0);
            if( rc==SQLITE_OK ){
              rc = sqlite3Fts5StorageDelete(pTab->pStorage, iNew, 0);
            }
            fts5StorageInsert(&rc, pTab, apVal, pRowid);
          }else{
            rc = sqlite3Fts5StorageContentInsert(pTab->pStorage, apVal, pRowid);
            if( rc==SQLITE_OK ){
              rc = sqlite3Fts5StorageDelete(pTab->pStorage, iOld, 0);
            }
            if( rc==SQLITE_OK ){
              rc = sqlite3Fts5StorageIndexInsert(pTab->pStorage, apVal,*pRowid);
            }
          }
        }else{
          rc = sqlite3Fts5StorageDelete(pTab->pStorage, iOld, 0);
          fts5StorageInsert(&rc, pTab, apVal, pRowid);
        }
      }
    }
  }

  pTab->p.pConfig->pzErrmsg = 0;
  return rc;
}